

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator.cpp
# Opt level: O1

void __thiscall SchemaValidator::SchemaValidator(SchemaValidator *this,char *json_schema)

{
  _Head_base<0UL,_rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_*,_false>
  _Var1;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *pGVar2;
  undefined8 __p;
  int iVar3;
  __uniq_ptr_data<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>,_true,_true>
  this_00;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *pGVar4;
  Ch *pCVar5;
  char *pcVar6;
  undefined1 local_128 [16];
  undefined1 local_118 [48];
  Stack<rapidjson::CrtAllocator> local_e8;
  undefined1 local_b0 [32];
  Document document;
  
  (this->schema_document_)._M_t.
  super___uniq_ptr_impl<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_*,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
  .
  super__Head_base<0UL,_rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_*,_false>
  ._M_head_impl =
       (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        *)0x0;
  (this->schema_validator_)._M_t.
  super___uniq_ptr_impl<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_*,_std::default_delete<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_>_>
  .
  super__Head_base<0UL,_rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_*,_false>
  ._M_head_impl =
       (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
        *)0x0;
  (this->error_)._M_dataplus._M_p = (pointer)&(this->error_).field_2;
  (this->error_)._M_string_length = 0;
  (this->error_).field_2._M_local_buf[0] = '\0';
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&document,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  local_128._0_8_ = json_schema;
  local_128._8_8_ = json_schema;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&document,(GenericStringStream<rapidjson::UTF8<char>_> *)local_128);
  if ((long)(int)document.parseResult_.code_ == 0) {
    this_00.
    super___uniq_ptr_impl<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_*,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
    .
    super__Head_base<0UL,_rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_impl<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
          )operator_new(0x108);
    local_118._16_8_ = (char *)0x0;
    local_118._24_8_ = (char *)0x0;
    local_118._0_8_ = (CrtAllocator *)0x0;
    local_118._8_8_ = (Token *)0x0;
    local_128._0_8_ = (Stack<rapidjson::CrtAllocator> *)0x0;
    local_128._8_8_ = (CrtAllocator *)0x0;
    local_118._32_8_ = local_118._32_8_ & 0xffffffff00000000;
    local_e8.allocator_ = (CrtAllocator *)0x4;
    rapidjson::
    GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::GenericSchemaDocument
              ((GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                *)this_00.
                  super___uniq_ptr_impl<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_*,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
                  .
                  super__Head_base<0UL,_rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_*,_false>
                  ._M_head_impl,
               &document.
                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ,(Ch *)0x0,0,(IRemoteSchemaDocumentProviderType *)0x0,(CrtAllocator *)0x0,
               (PointerType *)local_128,(Specification *)&local_e8);
    local_b0._0_8_ =
         this_00.
         super___uniq_ptr_impl<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_*,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
         .
         super__Head_base<0UL,_rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_*,_false>
         ._M_head_impl;
    rapidjson::
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                       *)local_128);
    __p = local_b0._0_8_;
    local_b0._0_8_ =
         (__uniq_ptr_impl<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
          )0x0;
    std::
    __uniq_ptr_impl<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
    ::reset((__uniq_ptr_impl<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
             *)this,(pointer)__p);
    std::
    unique_ptr<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
    ::~unique_ptr((unique_ptr<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
                   *)local_b0);
    _Var1._M_head_impl =
         (this->schema_document_)._M_t.
         super___uniq_ptr_impl<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_*,_std::default_delete<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
         .
         super__Head_base<0UL,_rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_*,_false>
         ._M_head_impl;
    pGVar4 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
              *)operator_new(0xe0);
    (pGVar4->
    super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
    )._vptr_ISchemaStateFactory = (_func_int **)&PTR__GenericSchemaValidator_00161098;
    (pGVar4->super_ISchemaValidator)._vptr_ISchemaValidator =
         (_func_int **)&PTR__GenericSchemaValidator_00161248;
    (pGVar4->
    super_IValidationErrorHandler<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
    )._vptr_IValidationErrorHandler = (_func_int **)&PTR__GenericSchemaValidator_00161280;
    pGVar4->schemaDocument_ = _Var1._M_head_impl;
    pGVar4->root_ = (_Var1._M_head_impl)->root_;
    pGVar4->stateAllocator_ = (CrtAllocator *)0x0;
    pGVar4->ownStateAllocator_ = (CrtAllocator *)0x0;
    (pGVar4->schemaStack_).allocator_ = (CrtAllocator *)0x0;
    (pGVar4->schemaStack_).ownAllocator_ = (CrtAllocator *)0x0;
    (pGVar4->schemaStack_).stack_ = (char *)0x0;
    (pGVar4->schemaStack_).stackTop_ = (char *)0x0;
    (pGVar4->schemaStack_).stackEnd_ = (char *)0x0;
    (pGVar4->schemaStack_).initialCapacity_ = 0x400;
    (pGVar4->documentStack_).allocator_ = (CrtAllocator *)0x0;
    (pGVar4->documentStack_).ownAllocator_ = (CrtAllocator *)0x0;
    (pGVar4->documentStack_).stack_ = (char *)0x0;
    (pGVar4->documentStack_).stackTop_ = (char *)0x0;
    (pGVar4->documentStack_).stackEnd_ = (char *)0x0;
    (pGVar4->documentStack_).initialCapacity_ = 0x100;
    (pGVar4->error_).data_.s.str = (Ch *)0x0;
    pGVar4->outputHandler_ = (BaseReaderHandler<rapidjson::UTF8<char>,_void> *)0x0;
    (pGVar4->error_).data_.n = (Number)0x0;
    (pGVar4->error_).data_.f.flags = 3;
    (pGVar4->currentError_).data_.n = (Number)0x0;
    (pGVar4->currentError_).data_.s.str = (Ch *)0x0;
    (pGVar4->missingDependents_).data_.n = (Number)0x0;
    (pGVar4->missingDependents_).data_.s.str = (Ch *)0x0;
    pGVar4->valid_ = true;
    pGVar4->flags_ = 0;
    pGVar4->depth_ = 0;
    pGVar2 = (this->schema_validator_)._M_t.
             super___uniq_ptr_impl<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_*,_std::default_delete<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_>_>
             .
             super__Head_base<0UL,_rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_*,_false>
             ._M_head_impl;
    (this->schema_validator_)._M_t.
    super___uniq_ptr_impl<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_*,_std::default_delete<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_>_>
    .
    super__Head_base<0UL,_rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_*,_false>
    ._M_head_impl = pGVar4;
    if (pGVar2 != (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                   *)0x0) {
      (*(pGVar2->
        super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
        )._vptr_ISchemaStateFactory[1])();
    }
    iVar3 = (*(((this->schema_validator_)._M_t.
                super___uniq_ptr_impl<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_*,_std::default_delete<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_>_>
                .
                super__Head_base<0UL,_rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_*,_false>
               ._M_head_impl)->
              super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
              )._vptr_ISchemaStateFactory[0xb])();
    if ((char)iVar3 == '\0') {
      local_e8.stack_ = (char *)0x0;
      local_e8.stackTop_ = (char *)0x0;
      local_e8.allocator_ = (CrtAllocator *)0x0;
      local_e8.ownAllocator_ = (CrtAllocator *)0x0;
      local_e8.stackEnd_ = (char *)0x0;
      local_e8.initialCapacity_ = 0x100;
      local_128._8_8_ = (CrtAllocator *)0x0;
      local_118._0_8_ = (CrtAllocator *)0x0;
      local_118._8_8_ = (Token *)0x0;
      local_118._16_8_ = (char *)0x0;
      local_118._24_8_ = (char *)0x0;
      local_118._32_8_ = 0x200;
      local_118._40_4_ = 0x144;
      local_118[0x2c] = false;
      local_128._0_8_ = &local_e8;
      rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
      Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                 &((this->schema_validator_)._M_t.
                   super___uniq_ptr_impl<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>,_std::default_delete<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_*,_std::default_delete<rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_>_>
                   .
                   super__Head_base<0UL,_rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>_*,_false>
                  ._M_head_impl)->error_,
                 (Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                  *)local_128);
      pCVar5 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
               GetString((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                         &local_e8);
      format_abi_cxx11_((string *)local_b0,"Invalid schema: %s",pCVar5);
      std::__cxx11::string::operator=((string *)&this->error_,(string *)local_b0);
      if ((GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *)local_b0._0_8_ !=
          (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *)(local_b0 + 0x10)) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
                ((Stack<rapidjson::CrtAllocator> *)(local_128 + 8));
      rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_e8);
    }
  }
  else {
    if (document.parseResult_.code_ < (kParseErrorTermination|kParseErrorDocumentRootNotSingular)) {
      pcVar6 = &DAT_00155dc0 +
               *(int *)((long)rapidjson::internal::DigitGen::kPow10 +
                       (long)(int)document.parseResult_.code_ * 4 + 0x9c);
    }
    else {
      pcVar6 = "Unknown error.";
    }
    format_abi_cxx11_((string *)local_128,"Failed to parse JSON Schema: %s (at %zi)",pcVar6,
                      document.parseResult_.offset_);
    std::__cxx11::string::operator=((string *)&this->error_,(string *)local_128);
    if ((Stack<rapidjson::CrtAllocator> *)local_128._0_8_ !=
        (Stack<rapidjson::CrtAllocator> *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_118._0_8_ + 1));
    }
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&document);
  return;
}

Assistant:

SchemaValidator::SchemaValidator(const char *json_schema) {
    rapidjson::Document document;
    document.Parse(json_schema);
    if (document.HasParseError()) {
        error_ = format(
            "Failed to parse JSON Schema: %s (at %zi)",
            GetParseError_En(document.GetParseError()),
            document.GetErrorOffset()
        );
        return;
    }

    schema_document_ = std::make_unique<rapidjson::SchemaDocument>(document);
    schema_validator_ = std::make_unique<rapidjson::SchemaValidator>(*schema_document_);

    if (!schema_validator_->IsValid()) {
        rapidjson::StringBuffer string_buffer;
        rapidjson::Writer<rapidjson::StringBuffer> writer(string_buffer);
        schema_validator_->GetError().Accept(writer);
        error_ = format(
            "Invalid schema: %s",
            string_buffer.GetString());
        return;
    }
}